

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O3

bool __thiscall
ON_OBSOLETE_V5_DimOrdinate::Read(ON_OBSOLETE_V5_DimOrdinate *this,ON_BinaryArchive *file)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int submajor_version;
  int minor_version;
  int major_version;
  int subminor_version;
  int local_30;
  int local_2c;
  int local_28 [2];
  
  bVar2 = false;
  local_28[0] = 0;
  local_2c = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk(file,0x40008000,local_28,&local_2c);
  if (bVar1) {
    bVar1 = false;
    if (local_28[0] == 1) {
      local_30 = 0;
      local_28[1] = 0;
      bVar2 = ON_BinaryArchive::BeginRead3dmChunk(file,0x40008000,&local_30,local_28 + 1);
      if (bVar2) {
        bVar2 = false;
        if (local_30 == 1) {
          bVar2 = ON_OBSOLETE_V5_Annotation::Read(&this->super_ON_OBSOLETE_V5_Annotation,file);
        }
        bVar3 = ON_BinaryArchive::EndRead3dmChunk(file);
        bVar1 = false;
        if (bVar3) {
          bVar1 = bVar2;
        }
        if (bVar1 == true) {
          bVar1 = ON_BinaryArchive::ReadInt
                            (file,(ON__INT32 *)&(this->super_ON_OBSOLETE_V5_Annotation).field_0xdc);
        }
      }
      if (0 < local_2c) {
        if (bVar1 != false) {
          bVar1 = ON_BinaryArchive::ReadDouble(file,&this->m_kink_offset_0);
        }
        if (bVar1 != false) {
          bVar1 = ON_BinaryArchive::ReadDouble(file,&this->m_kink_offset_1);
        }
      }
    }
    bVar2 = ON_BinaryArchive::EndRead3dmChunk(file);
    bVar2 = (bool)(bVar2 & bVar1);
  }
  return bVar2;
}

Assistant:

bool ON_OBSOLETE_V5_DimOrdinate::Read( ON_BinaryArchive& file )
{
  int major_version=0, minor_version=0;
  bool rc = file.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version);
  if (rc)
  {
    if ( 1 != major_version )
    {
      rc = false;
    }
    else
    {
      int submajor_version=0, subminor_version=0;

      // subchunk wraps ON_OBSOLETE_V5_Annotation field so this
      // function won't break if ON_OBSOLETE_V5_Annotation changes.
      rc = file.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&submajor_version,&subminor_version);
      if (rc)
      {
        if ( 1 != submajor_version )
          rc = false;
        else
        {
          rc = ON_OBSOLETE_V5_Annotation::Read( file) ? true : false;
        }
        if ( !file.EndRead3dmChunk() )
          rc = false;
      }

      if( rc) 
        rc = file.ReadInt( &m_direction);

      if( minor_version > 0)
      {
        if( rc) 
          rc = file.ReadDouble( &m_kink_offset_0);
        if( rc) 
          rc = file.ReadDouble( &m_kink_offset_1);
      }
    }

    if (!file.EndRead3dmChunk())
      rc = false;
  }
  return rc;
}